

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct4_w4_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  int iVar16;
  uint uVar17;
  int32_t *piVar18;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  int iVar19;
  int iVar26;
  int iVar28;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d0_1;
  __m128i c0_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i v0_1;
  __m128i u0_1;
  __m128i t0_1;
  __m128i d0;
  __m128i c0;
  __m128i b0;
  __m128i a0;
  __m128i v0;
  __m128i u0;
  __m128i t0;
  __m128i x [4];
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 local_338;
  undefined2 uStack_336;
  undefined2 uStack_334;
  undefined2 uStack_332;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  
  piVar18 = cospi_arr(0xc);
  uVar15 = CONCAT22((short)piVar18[0x20],(short)piVar18[0x20]);
  auVar5._4_4_ = uVar15;
  auVar5._0_4_ = uVar15;
  auVar5._12_4_ = uVar15;
  auVar5._8_4_ = uVar15;
  iVar16 = (piVar18[0x20] & 0xffffU) + piVar18[0x20] * -0x10000;
  auVar22._4_4_ = iVar16;
  auVar22._0_4_ = iVar16;
  auVar22._12_4_ = iVar16;
  auVar22._8_4_ = iVar16;
  iVar16 = (uint)*(ushort *)(piVar18 + 0x30) + piVar18[0x10] * -0x10000;
  auVar24._4_4_ = iVar16;
  auVar24._0_4_ = iVar16;
  auVar24._12_4_ = iVar16;
  auVar24._8_4_ = iVar16;
  uVar17 = (uint)*(ushort *)(piVar18 + 0x10) | piVar18[0x30] << 0x10;
  auVar25._4_4_ = uVar17;
  auVar25._0_4_ = uVar17;
  auVar25._12_4_ = uVar17;
  auVar25._8_4_ = uVar17;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[4];
  uVar3 = in_RDI[2];
  uVar4 = in_RDI[6];
  local_338 = (undefined2)uVar1;
  uStack_336 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_334 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_332 = (undefined2)((ulong)uVar1 >> 0x30);
  local_348 = (undefined2)uVar2;
  uStack_346 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_344 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_342 = (undefined2)((ulong)uVar2 >> 0x30);
  auVar6._2_2_ = local_348;
  auVar6._0_2_ = local_338;
  auVar6._4_2_ = uStack_336;
  auVar6._6_2_ = uStack_346;
  auVar6._10_2_ = uStack_344;
  auVar6._8_2_ = uStack_334;
  auVar6._12_2_ = uStack_332;
  auVar6._14_2_ = uStack_342;
  auVar20 = pmaddwd(auVar6,auVar5);
  auVar23._2_2_ = local_348;
  auVar23._0_2_ = local_338;
  auVar23._4_2_ = uStack_336;
  auVar23._6_2_ = uStack_346;
  auVar23._10_2_ = uStack_344;
  auVar23._8_2_ = uStack_334;
  auVar23._12_2_ = uStack_332;
  auVar23._14_2_ = uStack_342;
  auVar21 = pmaddwd(auVar23,auVar22);
  local_238 = auVar20._0_4_;
  iStack_234 = auVar20._4_4_;
  iStack_230 = auVar20._8_4_;
  iStack_22c = auVar20._12_4_;
  local_258 = auVar21._0_4_;
  iStack_254 = auVar21._4_4_;
  iStack_250 = auVar21._8_4_;
  iStack_24c = auVar21._12_4_;
  auVar20 = ZEXT416(0xc);
  iVar16 = local_238 + 0x800 >> auVar20;
  iVar26 = iStack_234 + 0x800 >> auVar20;
  iVar28 = iStack_230 + 0x800 >> auVar20;
  iVar30 = iStack_22c + 0x800 >> auVar20;
  auVar20 = ZEXT416(0xc);
  iVar19 = local_258 + 0x800 >> auVar20;
  iVar27 = iStack_254 + 0x800 >> auVar20;
  iVar29 = iStack_250 + 0x800 >> auVar20;
  iVar31 = iStack_24c + 0x800 >> auVar20;
  auVar14._4_4_ = iVar26;
  auVar14._0_4_ = iVar16;
  auVar14._12_4_ = iVar30;
  auVar14._8_4_ = iVar28;
  auVar13._4_4_ = iVar26;
  auVar13._0_4_ = iVar16;
  auVar13._12_4_ = iVar30;
  auVar13._8_4_ = iVar28;
  auVar22 = packssdw(auVar14,auVar13);
  auVar12._4_4_ = iVar27;
  auVar12._0_4_ = iVar19;
  auVar12._12_4_ = iVar31;
  auVar12._8_4_ = iVar29;
  auVar11._4_4_ = iVar27;
  auVar11._0_4_ = iVar19;
  auVar11._12_4_ = iVar31;
  auVar11._8_4_ = iVar29;
  auVar23 = packssdw(auVar12,auVar11);
  local_358 = (undefined2)uVar3;
  uStack_356 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_354 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_352 = (undefined2)((ulong)uVar3 >> 0x30);
  local_368 = (undefined2)uVar4;
  uStack_366 = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_364 = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_362 = (undefined2)((ulong)uVar4 >> 0x30);
  auVar21._2_2_ = local_368;
  auVar21._0_2_ = local_358;
  auVar21._4_2_ = uStack_356;
  auVar21._6_2_ = uStack_366;
  auVar21._10_2_ = uStack_364;
  auVar21._8_2_ = uStack_354;
  auVar21._12_2_ = uStack_352;
  auVar21._14_2_ = uStack_362;
  auVar24 = pmaddwd(auVar21,auVar24);
  auVar20._2_2_ = local_368;
  auVar20._0_2_ = local_358;
  auVar20._4_2_ = uStack_356;
  auVar20._6_2_ = uStack_366;
  auVar20._10_2_ = uStack_364;
  auVar20._8_2_ = uStack_354;
  auVar20._12_2_ = uStack_352;
  auVar20._14_2_ = uStack_362;
  auVar25 = pmaddwd(auVar20,auVar25);
  local_278 = auVar24._0_4_;
  iStack_274 = auVar24._4_4_;
  iStack_270 = auVar24._8_4_;
  iStack_26c = auVar24._12_4_;
  local_298 = auVar25._0_4_;
  iStack_294 = auVar25._4_4_;
  iStack_290 = auVar25._8_4_;
  iStack_28c = auVar25._12_4_;
  auVar25 = ZEXT416(0xc);
  iVar16 = local_278 + 0x800 >> auVar25;
  iVar26 = iStack_274 + 0x800 >> auVar25;
  iVar28 = iStack_270 + 0x800 >> auVar25;
  iVar30 = iStack_26c + 0x800 >> auVar25;
  auVar25 = ZEXT416(0xc);
  iVar19 = local_298 + 0x800 >> auVar25;
  iVar27 = iStack_294 + 0x800 >> auVar25;
  iVar29 = iStack_290 + 0x800 >> auVar25;
  iVar31 = iStack_28c + 0x800 >> auVar25;
  auVar10._4_4_ = iVar26;
  auVar10._0_4_ = iVar16;
  auVar10._12_4_ = iVar30;
  auVar10._8_4_ = iVar28;
  auVar9._4_4_ = iVar26;
  auVar9._0_4_ = iVar16;
  auVar9._12_4_ = iVar30;
  auVar9._8_4_ = iVar28;
  auVar25 = packssdw(auVar10,auVar9);
  auVar8._4_4_ = iVar27;
  auVar8._0_4_ = iVar19;
  auVar8._12_4_ = iVar31;
  auVar8._8_4_ = iVar29;
  auVar7._4_4_ = iVar27;
  auVar7._0_4_ = iVar19;
  auVar7._12_4_ = iVar31;
  auVar7._8_4_ = iVar29;
  auVar20 = packssdw(auVar8,auVar7);
  auVar24 = paddsw(auVar22,auVar20);
  *in_RSI = auVar24;
  auVar20 = psubsw(auVar22,auVar20);
  in_RSI[3] = auVar20;
  auVar20 = paddsw(auVar23,auVar25);
  in_RSI[1] = auVar20;
  auVar25 = psubsw(auVar23,auVar25);
  in_RSI[2] = auVar25;
  return;
}

Assistant:

static void idct4_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[4];
  x[0] = input[0];
  x[1] = input[2];
  x[2] = input[1];
  x[3] = input[3];

  // stage 2
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);

  // stage 3
  btf_16_adds_subs_out_sse2(output[0], output[3], x[0], x[3]);
  btf_16_adds_subs_out_sse2(output[1], output[2], x[1], x[2]);
}